

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summaryindex.cpp
# Opt level: O0

void summaryindex::doit(string *subfolder)

{
  uint uVar1;
  uint uVar2;
  FILE *pFVar3;
  iterator iVar4;
  bool bVar5;
  char *pcVar6;
  DIR *__dirp;
  dirent *pdVar7;
  ulong uVar8;
  undefined8 uVar9;
  pointer ppVar10;
  reference plVar11;
  bool local_251;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220 [32];
  _Base_ptr local_200;
  longlong *local_1f8;
  __normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_> local_1f0;
  __normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_> local_1e8;
  iterator v_iter;
  _Self local_1d8;
  iterator s_iter;
  uint local_1ac;
  int max_summary_id;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_198;
  iterator iter;
  FILE *fout;
  string filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168 [8];
  string s2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140 [39];
  allocator local_119;
  string local_118 [8];
  string s;
  int local_f4;
  int file_index;
  dirent *ent;
  DIR *dir;
  vector<int,_std::allocator<int>_> event_ids;
  map<summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  summary_id_file_id_to_offset;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [32];
  string local_30 [8];
  string path;
  string *subfolder_local;
  
  std::operator+((char *)local_30,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"work/");
  std::__cxx11::string::length();
  std::__cxx11::string::substr((ulong)local_50,(ulong)local_30);
  bVar5 = std::operator!=(local_50,"/");
  std::__cxx11::string::~string((string *)local_50);
  if (bVar5) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &files.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(char *)local_30);
    std::__cxx11::string::operator=
              (local_30,(string *)
                        &files.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &files.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&summary_id_file_id_to_offset._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  ::map((map<summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
         *)&event_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&dir);
  local_f4 = 0;
  pcVar6 = (char *)std::__cxx11::string::c_str();
  __dirp = opendir(pcVar6);
  pFVar3 = _stderr;
  if (__dirp == (DIR *)0x0) {
    uVar9 = std::__cxx11::string::c_str();
    fprintf(pFVar3,"FATAL: Unable to open directory %s\n",uVar9);
    exit(-1);
  }
  while (pdVar7 = readdir(__dirp), pdVar7 != (dirent *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_118,pdVar7->d_name,&local_119);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
    uVar8 = std::__cxx11::string::length();
    local_251 = false;
    if (4 < uVar8) {
      std::__cxx11::string::length();
      std::__cxx11::string::substr((ulong)local_140,(ulong)local_118);
      local_251 = std::operator==(local_140,".bin");
      std::__cxx11::string::~string((string *)local_140);
    }
    if (local_251 != false) {
      std::operator+(local_168,(char *)local_30);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&summary_id_file_id_to_offset._M_t._M_impl.super__Rb_tree_header._M_node_count,
                  (value_type *)local_118);
      indexevents(local_168,(vector<int,_std::allocator<int>_> *)&dir,
                  (map<summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                   *)&event_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,local_f4);
      local_f4 = local_f4 + 1;
      std::__cxx11::string::~string((string *)local_168);
    }
    std::__cxx11::string::~string(local_118);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout,
                 (char *)local_30);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  iter._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)fopen(pcVar6,"wb");
  pFVar3 = _stderr;
  if ((FILE *)iter._M_current == (FILE *)0x0) {
    uVar9 = std::__cxx11::string::c_str();
    fprintf(pFVar3,"FATAL: cannot open %s\n",uVar9);
    exit(1);
  }
  local_198._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&summary_id_file_id_to_offset._M_t._M_impl.super__Rb_tree_header._M_node_count);
  while( true ) {
    local_1a0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&summary_id_file_id_to_offset._M_t._M_impl.super__Rb_tree_header._M_node_count);
    bVar5 = __gnu_cxx::operator!=(&local_198,&local_1a0);
    iVar4 = iter;
    if (!bVar5) break;
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator->(&local_198);
    uVar9 = std::__cxx11::string::c_str();
    fprintf((FILE *)iVar4._M_current,"%s\n",uVar9);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_198,0);
  }
  fclose((FILE *)iter._M_current);
  local_1ac = 0;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s_iter,
                 (char *)local_30);
  std::__cxx11::string::operator=((string *)&fout,(string *)&s_iter);
  std::__cxx11::string::~string((string *)&s_iter);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  iter._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)fopen(pcVar6,"wb");
  pFVar3 = _stderr;
  if ((FILE *)iter._M_current == (FILE *)0x0) {
    uVar9 = std::__cxx11::string::c_str();
    fprintf(pFVar3,"FATAL: cannot open %s\n",uVar9);
    exit(1);
  }
  local_1d8._M_node =
       (_Base_ptr)
       std::
       map<summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
       ::begin((map<summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                *)&event_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  while( true ) {
    v_iter._M_current =
         (longlong *)
         std::
         map<summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
         ::end((map<summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                *)&event_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
    bVar5 = std::operator!=(&local_1d8,(_Self *)&v_iter);
    if (!bVar5) break;
    ppVar10 = std::
              _Rb_tree_iterator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>
              ::operator->(&local_1d8);
    if ((int)local_1ac < (ppVar10->first).summary_id) {
      ppVar10 = std::
                _Rb_tree_iterator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>
                ::operator->(&local_1d8);
      local_1ac = (ppVar10->first).summary_id;
    }
    ppVar10 = std::
              _Rb_tree_iterator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>
              ::operator->(&local_1d8);
    local_1e8._M_current =
         (longlong *)std::vector<long_long,_std::allocator<long_long>_>::begin(&ppVar10->second);
    while( true ) {
      ppVar10 = std::
                _Rb_tree_iterator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>
                ::operator->(&local_1d8);
      local_1f0._M_current =
           (longlong *)std::vector<long_long,_std::allocator<long_long>_>::end(&ppVar10->second);
      bVar5 = __gnu_cxx::operator!=(&local_1e8,&local_1f0);
      iVar4 = iter;
      if (!bVar5) break;
      ppVar10 = std::
                _Rb_tree_iterator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>
                ::operator->(&local_1d8);
      uVar1 = (ppVar10->first).summary_id;
      ppVar10 = std::
                _Rb_tree_iterator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>
                ::operator->(&local_1d8);
      uVar2 = (ppVar10->first).fileindex;
      plVar11 = __gnu_cxx::
                __normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                ::operator*(&local_1e8);
      fprintf((FILE *)iVar4._M_current,"%d, %d, %lld\n",(ulong)uVar1,(ulong)uVar2,*plVar11);
      local_1f8 = (longlong *)
                  __gnu_cxx::
                  __normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                  ::operator++(&local_1e8,0);
    }
    local_200 = (_Base_ptr)
                std::
                _Rb_tree_iterator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>
                ::operator++(&local_1d8,0);
  }
  fclose((FILE *)iter._M_current);
  std::operator+(local_220,(char *)local_30);
  std::__cxx11::string::operator=((string *)&fout,(string *)local_220);
  std::__cxx11::string::~string((string *)local_220);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  iter._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)fopen(pcVar6,"wb");
  pFVar3 = _stderr;
  if ((FILE *)iter._M_current == (FILE *)0x0) {
    uVar9 = std::__cxx11::string::c_str();
    fprintf(pFVar3,"FATAL: cannot open %s\n",uVar9);
    exit(1);
  }
  fprintf((FILE *)iter._M_current,"%d",(ulong)local_1ac);
  fclose((FILE *)iter._M_current);
  std::__cxx11::string::~string((string *)&fout);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&dir);
  std::
  map<summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  ::~map((map<summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
          *)&event_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&summary_id_file_id_to_offset._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void doit(const std::string& subfolder)
{	
	std::string path = "work/" + subfolder;
	if (path.substr(path.length() - 1, 1) != "/") {
		path = path + "/";
	}

	std::vector<std::string> files;
	//std::map<int, std::vector<int>> summary_id_to_events;
	std::map<summary_keyz, std::vector<long long>> summary_id_file_id_to_offset;
	std::vector<int> event_ids;
	DIR* dir;
	struct dirent* ent;
	int file_index = 0;
	if ((dir = opendir(path.c_str())) != NULL) {
		while ((ent = readdir(dir)) != NULL) {
			std::string s = ent->d_name;
			if (s.length() > 4 && s.substr(s.length() - 4, 4) == ".bin") {
				std::string s2 = path + ent->d_name;
				files.push_back(s);
				indexevents(s2, event_ids, summary_id_file_id_to_offset, file_index);
				file_index++;
			}
		}
	}
	else {
		fprintf(stderr, "FATAL: Unable to open directory %s\n", path.c_str());
		exit(-1);
	}

	std::string filename =  path + "filelist.idx";
	FILE* fout = fopen(filename.c_str(), "wb");
	if (fout == NULL) {
		fprintf(stderr, "FATAL: cannot open %s\n",  filename.c_str());
		exit(EXIT_FAILURE);
	}
	auto iter = files.begin();
	while (iter != files.end()) {
		fprintf(fout, "%s\n", iter->c_str());
		iter++;
	}

	fclose(fout);


	int max_summary_id = 0;
	filename = path + "summaries.idx";
	fout = fopen(filename.c_str(), "wb");
	if (fout == NULL) {
		fprintf(stderr, "FATAL: cannot open %s\n", filename.c_str());
		exit(EXIT_FAILURE);
	}

	auto s_iter = summary_id_file_id_to_offset.begin();
	while (s_iter != summary_id_file_id_to_offset.end()) {
		if (s_iter->first.summary_id > max_summary_id) max_summary_id = s_iter->first.summary_id;
		auto v_iter = s_iter->second.begin();
		while (v_iter != s_iter->second.end()) {
			fprintf(fout, "%d, %d, %lld\n", s_iter->first.summary_id, s_iter->first.fileindex, *v_iter);
			v_iter++;
		}
		s_iter++;
	}
	fclose(fout);

	filename = path + "max_summary_id.idx";
	fout = fopen(filename.c_str(), "wb");
	if (fout == NULL) {
		fprintf(stderr, "FATAL: cannot open %s\n",  filename.c_str());
		exit(EXIT_FAILURE);
	}
	fprintf(fout, "%d", max_summary_id);
	fclose(fout);
	
}